

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O1

int32 read_kd_nodes(FILE *fp,kd_tree_node_t *node,uint32 level)

{
  int32 iVar1;
  uint uVar2;
  int iVar3;
  int32 iVar4;
  undefined8 in_RAX;
  uint8 *puVar5;
  kd_tree_node_t *pkVar6;
  int32 optional;
  char *fmt;
  long ln;
  ulong uVar7;
  ulong uVar8;
  uint32 n;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  iVar1 = read_tree_int(fp,"NODE",(uint32 *)((long)&uStack_38 + 4),0);
  iVar4 = -1;
  if (-1 < iVar1) {
    uVar7 = (ulong)uStack_38._4_4_;
    if (uStack_38._4_4_ == level) {
      optional = 0;
      iVar1 = read_tree_int(fp,"split_comp",&node->split_comp,0);
      if (((-1 < iVar1) &&
          (iVar1 = read_tree_float(fp,"split_plane",&node->split_plane,optional), -1 < iVar1)) &&
         (iVar1 = read_tree_int(fp,"bbi",(uint32 *)((long)&uStack_38 + 4),1), -1 < iVar1)) {
        puVar5 = (uint8 *)__ckd_calloc__((ulong)node->n_density,1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                                         ,0x1ad);
        node->bbi = puVar5;
        if (1 < iVar1) {
          if (node->n_density <= uStack_38._4_4_) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                    ,0x1b0,"BBI Gaussian %d out of range! %d\n");
            return -1;
          }
          puVar5[uStack_38._4_4_] = '\x01';
          uVar2 = __isoc99_fscanf(fp,"%d",(long)&uStack_38 + 4);
          if (uVar2 != 0) {
            do {
              uVar8 = (ulong)uVar2;
              iVar3 = feof((FILE *)fp);
              if (iVar3 != 0) break;
              uVar7 = (ulong)uStack_38._4_4_;
              if (node->n_density <= uStack_38._4_4_) {
                fmt = "BBI Gaussian %d out of range! %d\n";
                ln = 0x1b8;
                goto LAB_0010dfd8;
              }
              node->bbi[uVar7] = '\x01';
              uVar2 = __isoc99_fscanf(fp,"%d",(long)&uStack_38 + 4);
            } while (uVar2 != 0);
          }
        }
        iVar4 = 0;
        if (level != 1) {
          pkVar6 = (kd_tree_node_t *)
                   __ckd_calloc__(1,0x58,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                                  ,0x1c2);
          node->left = pkVar6;
          pkVar6->n_density = node->n_density;
          pkVar6->n_comp = node->n_comp;
          iVar1 = read_kd_nodes(fp,pkVar6,level - 1);
          iVar4 = -1;
          if (-1 < iVar1) {
            pkVar6 = (kd_tree_node_t *)
                     __ckd_calloc__(1,0x58,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
                                    ,0x1c7);
            node->right = pkVar6;
            pkVar6->n_density = node->n_density;
            pkVar6->n_comp = node->n_comp;
            iVar4 = read_kd_nodes(fp,pkVar6,level - 1);
            iVar4 = iVar4 >> 0x1f;
          }
        }
      }
    }
    else {
      fmt = "Levels for node don\'t match (%d != %d)\n";
      ln = 0x1a4;
      uVar8 = (ulong)level;
LAB_0010dfd8:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/kdtree.c"
              ,ln,fmt,uVar7,uVar8);
    }
  }
  return iVar4;
}

Assistant:

int32
read_kd_nodes(FILE *fp, kd_tree_node_t *node, uint32 level)
{
	uint32 n;
	int i;

	if (read_tree_int(fp, "NODE", &n, FALSE) < 0)
		return -1;
	if (n != level) {
		E_ERROR("Levels for node don't match (%d != %d)\n", n, level);
		return -1;
	}
	if (read_tree_int(fp, "split_comp", &node->split_comp, FALSE) < 0)
		return -1;
	if (read_tree_float(fp, "split_plane", &node->split_plane, FALSE) < 0)
		return -1;
	if ((i = read_tree_int(fp, "bbi", &n, TRUE)) < 0)
		return -1;
	node->bbi = ckd_calloc(node->n_density, sizeof(*node->bbi));
	if (i > 1) {
		if (n >= node->n_density) {
			E_ERROR("BBI Gaussian %d out of range! %d\n", n);
			return -1;
		}
		node->bbi[n] = 1;
		while ((i = fscanf(fp, "%d", &n))) {
			if (feof(fp))
				break;
			if (n >= node->n_density) {
				E_ERROR("BBI Gaussian %d out of range! %d\n", n, i);
				return -1;
			}
			node->bbi[n] = 1;
		}
	}

	if (level == 1)
		return 0;

	node->left = ckd_calloc(1, sizeof(*node->left));
	node->left->n_density = node->n_density;
	node->left->n_comp = node->n_comp;
	if (read_kd_nodes(fp, node->left, level-1) < 0)
		return -1;
	node->right = ckd_calloc(1, sizeof(*node->left));
	node->right->n_density = node->n_density;
	node->right->n_comp = node->n_comp;
	if (read_kd_nodes(fp, node->right, level-1) < 0)
		return -1;
	return 0;
}